

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::LoadStoreMachine::RunStage(LoadStoreMachine *this,int stage)

{
  bool bVar1;
  int i;
  long lVar2;
  long lVar3;
  Vector<float,_4> local_30;
  Vector<float,_4> local_20;
  
  this->m_stage = stage;
  bVar1 = ShaderImageLoadStoreBase::AreOutputsAvailable(&this->super_ShaderImageLoadStoreBase,stage)
  ;
  lVar3 = 0x10;
  if (bVar1) {
    local_20.m_data[0] = 1.0;
    local_20.m_data[1] = 2.0;
    local_20.m_data[2] = 3.0;
    local_20.m_data[3] = 4.0;
    local_30.m_data[0] = 1.0;
    local_30.m_data[1] = 2.0;
    local_30.m_data[2] = 3.0;
    local_30.m_data[3] = 4.0;
    bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                      ((LoadStoreMachine *)this,0x8814,&local_20,&local_30);
    lVar3 = -1;
    if (bVar1) {
      local_20.m_data[0] = 1.0;
      local_20.m_data[1] = 2.0;
      local_20.m_data[2] = 3.0;
      local_20.m_data[3] = 4.0;
      local_30.m_data[0] = 1.0;
      local_30.m_data[1] = 0.0;
      local_30.m_data[2] = 0.0;
      local_30.m_data[3] = 1.0;
      bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                        ((LoadStoreMachine *)this,0x822e,&local_20,&local_30);
      if (bVar1) {
        local_20.m_data[0] = 1.0;
        local_20.m_data[1] = 2.0;
        local_20.m_data[2] = 3.0;
        local_20.m_data[3] = 4.0;
        local_30.m_data[0] = 1.0;
        local_30.m_data[1] = 2.0;
        local_30.m_data[2] = 3.0;
        local_30.m_data[3] = 4.0;
        bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
                          ((LoadStoreMachine *)this,0x881a,&local_20,&local_30);
        if (bVar1) {
          local_20.m_data[0] = 1.4013e-45;
          local_20.m_data[1] = -NAN;
          local_20.m_data[2] = 4.2039e-45;
          local_20.m_data[3] = -NAN;
          local_30.m_data[0] = 1.4013e-45;
          local_30.m_data[1] = -NAN;
          local_30.m_data[2] = 4.2039e-45;
          local_30.m_data[3] = -NAN;
          bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                            ((LoadStoreMachine *)this,0x8d82,(Vector<int,_4> *)&local_20,
                             (Vector<int,_4> *)&local_30);
          if (bVar1) {
            local_20.m_data[0] = 1.4013e-45;
            local_20.m_data[1] = -NAN;
            local_20.m_data[2] = 4.2039e-45;
            local_20.m_data[3] = -NAN;
            local_30.m_data[0] = 1.4013e-45;
            local_30.m_data[1] = 0.0;
            local_30.m_data[2] = 0.0;
            local_30.m_data[3] = 1.4013e-45;
            bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                              ((LoadStoreMachine *)this,0x8235,(Vector<int,_4> *)&local_20,
                               (Vector<int,_4> *)&local_30);
            if (bVar1) {
              local_20.m_data[0] = 1.4013e-45;
              local_20.m_data[1] = -NAN;
              local_20.m_data[2] = 4.2039e-45;
              local_20.m_data[3] = -NAN;
              local_30.m_data[0] = 1.4013e-45;
              local_30.m_data[1] = -NAN;
              local_30.m_data[2] = 4.2039e-45;
              local_30.m_data[3] = -NAN;
              bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                                ((LoadStoreMachine *)this,0x8d88,(Vector<int,_4> *)&local_20,
                                 (Vector<int,_4> *)&local_30);
              if (bVar1) {
                local_20.m_data[0] = 1.4013e-45;
                local_20.m_data[1] = -NAN;
                local_20.m_data[2] = 4.2039e-45;
                local_20.m_data[3] = -NAN;
                local_30.m_data[0] = 1.4013e-45;
                local_30.m_data[1] = -NAN;
                local_30.m_data[2] = 4.2039e-45;
                local_30.m_data[3] = -NAN;
                bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<int,4>>
                                  ((LoadStoreMachine *)this,0x8d8e,(Vector<int,_4> *)&local_20,
                                   (Vector<int,_4> *)&local_30);
                if (bVar1) {
                  local_20.m_data[0] = 0.0;
                  local_20.m_data[1] = 1.4013e-45;
                  local_20.m_data[2] = 2.8026e-45;
                  local_20.m_data[3] = 4.2039e-45;
                  local_30.m_data[0] = 0.0;
                  local_30.m_data[1] = 1.4013e-45;
                  local_30.m_data[2] = 2.8026e-45;
                  local_30.m_data[3] = 4.2039e-45;
                  bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                          Write<tcu::Vector<unsigned_int,4>>
                                    ((LoadStoreMachine *)this,0x8d70,
                                     (Vector<unsigned_int,_4> *)&local_20,
                                     (Vector<unsigned_int,_4> *)&local_30);
                  if (bVar1) {
                    local_20.m_data[0] = 9.80909e-45;
                    local_20.m_data[1] = 2.8026e-45;
                    local_20.m_data[2] = 4.2039e-45;
                    local_20.m_data[3] = 5.60519e-45;
                    local_30.m_data[0] = 9.80909e-45;
                    local_30.m_data[1] = 0.0;
                    local_30.m_data[2] = 0.0;
                    local_30.m_data[3] = 1.4013e-45;
                    bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                            Write<tcu::Vector<unsigned_int,4>>
                                      ((LoadStoreMachine *)this,0x8236,
                                       (Vector<unsigned_int,_4> *)&local_20,
                                       (Vector<unsigned_int,_4> *)&local_30);
                    if (bVar1) {
                      local_20.m_data[0] = 0.0;
                      local_20.m_data[1] = 1.4013e-45;
                      local_20.m_data[2] = 2.8026e-45;
                      local_20.m_data[3] = 4.2039e-45;
                      local_30.m_data[0] = 0.0;
                      local_30.m_data[1] = 1.4013e-45;
                      local_30.m_data[2] = 2.8026e-45;
                      local_30.m_data[3] = 4.2039e-45;
                      bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                              Write<tcu::Vector<unsigned_int,4>>
                                        ((LoadStoreMachine *)this,0x8d76,
                                         (Vector<unsigned_int,_4> *)&local_20,
                                         (Vector<unsigned_int,_4> *)&local_30);
                      if (bVar1) {
                        local_20.m_data[0] = 0.0;
                        local_20.m_data[1] = 1.4013e-45;
                        local_20.m_data[2] = 2.8026e-45;
                        local_20.m_data[3] = 4.2039e-45;
                        local_30.m_data[0] = 0.0;
                        local_30.m_data[1] = 1.4013e-45;
                        local_30.m_data[2] = 2.8026e-45;
                        local_30.m_data[3] = 4.2039e-45;
                        bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                                Write<tcu::Vector<unsigned_int,4>>
                                          ((LoadStoreMachine *)this,0x8d7c,
                                           (Vector<unsigned_int,_4> *)&local_20,
                                           (Vector<unsigned_int,_4> *)&local_30);
                        if (bVar1) {
                          lVar2 = 0;
                          do {
                            local_20.m_data[lVar2] = 1.0;
                            lVar2 = lVar2 + 1;
                          } while (lVar2 != 4);
                          lVar2 = 0;
                          do {
                            local_30.m_data[lVar2] = 1.0;
                            lVar2 = lVar2 + 1;
                          } while (lVar2 != 4);
                          bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                                  Write<tcu::Vector<float,4>>
                                            ((LoadStoreMachine *)this,0x8058,&local_20,&local_30);
                          if (bVar1) {
                            local_20.m_data[0] = 1.0;
                            local_20.m_data[1] = -1.0;
                            local_20.m_data[2] = 1.0;
                            local_20.m_data[3] = -1.0;
                            local_30.m_data[0] = 1.0;
                            local_30.m_data[1] = -1.0;
                            local_30.m_data[2] = 1.0;
                            local_30.m_data[3] = -1.0;
                            bVar1 = glcts::(anonymous_namespace)::LoadStoreMachine::
                                    Write<tcu::Vector<float,4>>
                                              ((LoadStoreMachine *)this,0x8f97,&local_20,&local_30);
                            lVar3 = (ulong)bVar1 - 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar3;
}

Assistant:

long RunStage(int stage)
	{
		m_stage = stage;
		if (!AreOutputsAvailable(5))
			return NOT_SUPPORTED;

		if (!Write(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Write(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Write(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;

		if (!Write(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_R32I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;
		if (!Write(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;

		if (!Write(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;
		if (!Write(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Write(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;

		if (!Write(GL_RGBA8, vec4(1.0f), vec4(1.0f)))
			return ERROR;

		if (!Write(GL_RGBA8_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
			return ERROR;

		return NO_ERROR;
	}